

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgmesh.cpp
# Opt level: O2

void __thiscall TPZGeoMesh::~TPZGeoMesh(TPZGeoMesh *this,void **vtt)

{
  (this->super_TPZSavable)._vptr_TPZSavable = (_func_int **)*vtt;
  CleanUp(this);
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_int>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  ::~_Rb_tree(&(this->fInterfaceMaterials)._M_t);
  TPZAdmChunkVector<TPZGeoNode,_10>::~TPZAdmChunkVector(&this->fNodeVec);
  TPZAdmChunkVector<TPZGeoEl_*,_10>::~TPZAdmChunkVector(&this->fElementVec);
  std::__cxx11::string::~string((string *)&this->fName);
  return;
}

Assistant:

TPZGeoMesh::~TPZGeoMesh()
{
#ifdef PZDEBUG2
    std::cout << "Deleting TPZGeoMesh " << (void *) this << std::endl;
#endif
	CleanUp();
}